

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall Network::printLastResult(Network *this)

{
  ostream *poVar1;
  ulong uVar2;
  
  if (this->layers[this->layerCount - 1]->nodeCount != 0) {
    uVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Prediction: ",0xc);
      poVar1 = std::ostream::_M_insert<double>(this->layers[this->layerCount - 1]->neurons[uVar2]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->layers[this->layerCount - 1]->nodeCount);
  }
  return;
}

Assistant:

void Network::printLastResult() {
	for (size_t i = 0; i < layers[layerCount - 1]->nodeCount; i++) {
		std::cout << "Prediction: " << layers[layerCount - 1]->neurons[i] << std::endl;
	}
}